

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

void __thiscall Vault::KeyValue::KeyValue(KeyValue *this,Client *client,SecretMount *mount)

{
  SecretMount *mount_local;
  Client *client_local;
  KeyValue *this_local;
  
  this->client_ = client;
  this->version_ = v2;
  Tiny<Vault::SecretMountDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->mount_,mount);
  return;
}

Assistant:

Vault::KeyValue::KeyValue(const Vault::Client &client, Vault::SecretMount mount)
    : client_(client)
    , version_(KeyValue::Version::v2)
    , mount_(std::move(mount)) {}